

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_primitive_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::RepeatedPrimitiveFieldGenerator::GenerateByteSize
          (RepeatedPrimitiveFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  int iVar1;
  char *pcVar2;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,"{\n  int data_size = 0;\n");
  io::Printer::Indent(printer);
  iVar1 = anon_unknown_3::FixedSize(*(Type *)(this->descriptor_ + 0x2c));
  pcVar2 = "data_size = $fixed_size$ * this->$name$_size();\n";
  if (iVar1 == -1) {
    pcVar2 = 
    "for (int i = 0; i < this->$name$_size(); i++) {\n  data_size += ::google::protobuf::internal::WireFormatLite::\n    $declared_type$Size(this->$name$(i));\n}\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar2);
  pcVar2 = "total_size += $tag_size$ * this->$name$_size() + data_size;\n";
  if (*(char *)(*(long *)(this->descriptor_ + 0x60) + 0x44) != '\0') {
    pcVar2 = 
    "if (data_size > 0) {\n  total_size += $tag_size$ +\n    ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);\n}\nGOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n_$name$_cached_byte_size_ = data_size;\nGOOGLE_SAFE_CONCURRENT_WRITES_END();\ntotal_size += data_size;\n"
    ;
  }
  io::Printer::Print(printer,variables,pcVar2);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void RepeatedPrimitiveFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  printer->Print(variables_,
    "{\n"
    "  int data_size = 0;\n");
  printer->Indent();
  int fixed_size = FixedSize(descriptor_->type());
  if (fixed_size == -1) {
    printer->Print(variables_,
      "for (int i = 0; i < this->$name$_size(); i++) {\n"
      "  data_size += ::google::protobuf::internal::WireFormatLite::\n"
      "    $declared_type$Size(this->$name$(i));\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "data_size = $fixed_size$ * this->$name$_size();\n");
  }

  if (descriptor_->options().packed()) {
    printer->Print(variables_,
      "if (data_size > 0) {\n"
      "  total_size += $tag_size$ +\n"
      "    ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);\n"
      "}\n"
      "GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();\n"
      "_$name$_cached_byte_size_ = data_size;\n"
      "GOOGLE_SAFE_CONCURRENT_WRITES_END();\n"
      "total_size += data_size;\n");
  } else {
    printer->Print(variables_,
      "total_size += $tag_size$ * this->$name$_size() + data_size;\n");
  }
  printer->Outdent();
  printer->Print("}\n");
}